

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PBool::PBool(PBool *this)

{
  bool bVar1;
  DObject *this_00;
  FName local_14;
  
  PInt::PInt(&this->super_PInt,1,true);
  *(undefined ***)&this->super_PInt = &PTR_StaticType_007c7878;
  this_00 = &PSymbolTable::FindSymbol
                       ((PSymbolTable *)&(this->super_PInt).field_0x38,&local_14,false)->
             super_DObject;
  if (this_00 != (DObject *)0x0) {
    bVar1 = DObject::IsKindOf(this_00,PSymbolConstNumeric::RegistrationInfo.MyClass);
    if (bVar1) {
      *(undefined4 *)&this_00[1].Class = 1;
      return;
    }
  }
  __assert_fail("maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x46a,"PBool::PBool()");
}

Assistant:

PBool::PBool()
: PInt(sizeof(bool), true)
{
	// Override the default max set by PInt's constructor
	PSymbolConstNumeric *maxsym = static_cast<PSymbolConstNumeric *>(Symbols.FindSymbol(NAME_Max, false));
	assert(maxsym != NULL && maxsym->IsKindOf(RUNTIME_CLASS(PSymbolConstNumeric)));
	maxsym->Value = 1;
}